

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5UnicodeDelete(Fts5Tokenizer *pTok)

{
  if (pTok != (Fts5Tokenizer *)0x0) {
    sqlite3_free(*(void **)(pTok + 0x98));
    sqlite3_free(*(void **)(pTok + 0x80));
    sqlite3_free(pTok);
    return;
  }
  return;
}

Assistant:

static void fts5UnicodeDelete(Fts5Tokenizer *pTok){
  if( pTok ){
    Unicode61Tokenizer *p = (Unicode61Tokenizer*)pTok;
    sqlite3_free(p->aiException);
    sqlite3_free(p->aFold);
    sqlite3_free(p);
  }
  return;
}